

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerExceptionManager.cxx
# Opt level: O2

void __thiscall
cmDebugger::cmDebuggerExceptionManager::HandleInitializeRequest
          (cmDebuggerExceptionManager *this,CMakeInitializeResponse *response)

{
  mapped_type *pmVar1;
  __node_base *p_Var2;
  array<dap::ExceptionBreakpointsFilter> exceptionBreakpointFilters;
  unique_lock<std::mutex> lock;
  ExceptionBreakpointsFilter filter;
  vector<dap::ExceptionBreakpointsFilter,_std::allocator<dap::ExceptionBreakpointsFilter>_> local_f8
  ;
  unique_lock<std::mutex> local_e0;
  undefined1 local_d0 [120];
  _Alloc_hider local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  optional<dap::boolean> local_38;
  
  std::unique_lock<std::mutex>::unique_lock(&local_e0,&this->Mutex);
  (response->supportsExceptionInfoRequest).val = true;
  (response->supportsExceptionInfoRequest).set = true;
  local_f8.
  super__Vector_base<dap::ExceptionBreakpointsFilter,_std::allocator<dap::ExceptionBreakpointsFilter>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.
  super__Vector_base<dap::ExceptionBreakpointsFilter,_std::allocator<dap::ExceptionBreakpointsFilter>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<dap::ExceptionBreakpointsFilter,_std::allocator<dap::ExceptionBreakpointsFilter>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var2 = &(this->ExceptionMap)._M_h._M_before_begin;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    local_d0._0_8_ = local_d0 + 0x10;
    local_d0._8_8_ = 0;
    local_d0[0x10] = '\0';
    local_d0[0x20] = false;
    local_d0[0x28] = false;
    local_d0[0x29] = false;
    local_d0._48_8_ = local_d0 + 0x40;
    local_d0._56_8_ = 0;
    local_d0[0x40] = '\0';
    local_d0[0x50] = false;
    local_d0._88_8_ = local_d0 + 0x68;
    local_d0._96_8_ = 0;
    local_d0[0x68] = '\0';
    local_58._M_p = (pointer)&local_48;
    local_50 = 0;
    local_48._M_local_buf[0] = '\0';
    local_38.val.val = false;
    local_38.set = false;
    std::__cxx11::string::_M_assign((string *)(local_d0 + 0x58));
    std::__cxx11::string::_M_assign((string *)&local_58);
    pmVar1 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->RaiseExceptions,(key_type *)(local_d0 + 0x58));
    local_d0[0x29] = true;
    local_d0[0x28] = *pmVar1;
    std::vector<dap::ExceptionBreakpointsFilter,std::allocator<dap::ExceptionBreakpointsFilter>>::
    emplace_back<dap::ExceptionBreakpointsFilter&>
              ((vector<dap::ExceptionBreakpointsFilter,std::allocator<dap::ExceptionBreakpointsFilter>>
                *)&local_f8,(ExceptionBreakpointsFilter *)local_d0);
    dap::ExceptionBreakpointsFilter::~ExceptionBreakpointsFilter
              ((ExceptionBreakpointsFilter *)local_d0);
  }
  dap::
  optional<std::vector<dap::ExceptionBreakpointsFilter,std::allocator<dap::ExceptionBreakpointsFilter>>>
  ::operator=((optional<std::vector<dap::ExceptionBreakpointsFilter,std::allocator<dap::ExceptionBreakpointsFilter>>>
               *)&response->exceptionBreakpointFilters,&local_f8);
  std::vector<dap::ExceptionBreakpointsFilter,_std::allocator<dap::ExceptionBreakpointsFilter>_>::
  ~vector(&local_f8);
  std::unique_lock<std::mutex>::~unique_lock(&local_e0);
  return;
}

Assistant:

void cmDebuggerExceptionManager::HandleInitializeRequest(
  dap::CMakeInitializeResponse& response)
{
  std::unique_lock<std::mutex> lock(Mutex);
  response.supportsExceptionInfoRequest = true;

  dap::array<dap::ExceptionBreakpointsFilter> exceptionBreakpointFilters;
  for (auto& pair : ExceptionMap) {
    dap::ExceptionBreakpointsFilter filter;
    filter.filter = pair.second.Filter;
    filter.label = pair.second.Label;
    filter.def = RaiseExceptions[filter.filter];
    exceptionBreakpointFilters.emplace_back(filter);
  }

  response.exceptionBreakpointFilters = exceptionBreakpointFilters;
}